

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor.cpp
# Opt level: O3

void __thiscall Cryptor::show_statistics(Cryptor *this)

{
  pointer pcVar1;
  long *plVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string s2;
  string s;
  stringstream ss;
  long *local_228;
  long local_220;
  long local_218 [2];
  bitset<8UL> local_208;
  char *local_200;
  long local_1f8;
  char local_1f0;
  undefined7 uStack_1ef;
  char *local_1e0;
  long local_1d8;
  char local_1d0;
  undefined7 uStack_1cf;
  Cryptor *local_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1e0 = &local_1d0;
  local_1d8 = 0;
  local_1d0 = '\0';
  local_200 = &local_1f0;
  local_1f8 = 0;
  local_1f0 = '\0';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---------------",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"input message: ",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  pcVar1 = (this->in_message_)._M_dataplus._M_p;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,pcVar1 + (this->in_message_)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_1b8,local_1b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  pcVar1 = (this->in_message_)._M_dataplus._M_p;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,pcVar1 + (this->in_message_)._M_string_length);
  lVar4 = std::__cxx11::string::find_first_not_of((char *)&local_1b8,0x10c4c8,0);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  if (lVar4 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"or binary: ",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    local_228 = local_218;
    pcVar1 = (this->in_message_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar1,pcVar1 + (this->in_message_)._M_string_length);
    lVar4 = local_220;
    plVar2 = local_228;
    if (local_220 != 0) {
      lVar5 = 0;
      local_1c0 = this;
      do {
        local_208.super__Base_bitset<1UL>._M_w._1_7_ = 0;
        local_208.super__Base_bitset<1UL>._M_w._0_1_ = *(byte *)((long)plVar2 + lVar5);
        std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&local_208);
        std::ostream::flush();
        lVar5 = lVar5 + 1;
        this = local_1c0;
      } while (lVar4 != lVar5);
    }
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_228);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_1e0,local_1d8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"output: ",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  pcVar1 = (this->out_message_)._M_dataplus._M_p;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,pcVar1 + (this->out_message_)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_1b8,local_1b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  pcVar1 = (this->out_message_)._M_dataplus._M_p;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,pcVar1 + (this->out_message_)._M_string_length);
  lVar4 = std::__cxx11::string::find_first_not_of((char *)&local_1b8,0x10c4c8,0);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  if (lVar4 == -1) {
    pcVar1 = (this->out_message_)._M_dataplus._M_p;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar1,pcVar1 + (this->out_message_)._M_string_length);
    std::__cxx11::string::operator=((string *)&local_200,(string *)&local_1b8);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"or binary: ",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    local_228 = local_218;
    pcVar1 = (this->out_message_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar1,pcVar1 + (this->out_message_)._M_string_length);
    plVar2 = local_228;
    if (local_220 != 0) {
      lVar4 = 0;
      do {
        local_208.super__Base_bitset<1UL>._M_w._1_7_ = 0;
        local_208.super__Base_bitset<1UL>._M_w._0_1_ = *(byte *)((long)plVar2 + lVar4);
        std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&local_208);
        std::ostream::flush();
        lVar4 = lVar4 + 1;
      } while (local_220 != lVar4);
    }
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_200,(string *)&local_228);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_200,local_1f8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---------------",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  lVar5 = local_1d8;
  lVar4 = local_1f8;
  if (this->show_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression: ",0xd);
    lVar4 = lVar5 - lVar4;
    auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = 0x45300000;
    poVar3 = std::ostream::_M_insert<double>
                       ((((auVar7._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 100.0) /
                        ((auVar6._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---------------",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
  }
  return;
}

Assistant:

void Cryptor::show_statistics() {
  string s;
  string s2;
  cout << "---------------" << endl;
  cout << "input message: " << endl;
  cout << " " << get_in_message() << endl;
  if (get_in_message().find_first_not_of("01") != string::npos) {
    cout << "or binary: " << endl;
    stringstream ss;
    for (auto i : get_in_message()) {
      ss << bitset<8>(static_cast<unsigned long long int>(i)) << flush;
    }
    s = ss.str();
    cout << " " << s << endl;
  }
  cout << endl;

  cout << "output: " << endl;
  cout << " " << get_out_message() << endl;
  if (get_out_message().find_first_not_of("01") != string::npos) {
    cout << "or binary: " << endl;
    stringstream ss2;
    for (auto i : get_out_message()) {
      ss2 << bitset<8>(static_cast<unsigned long long int>(i)) << flush;
    }
    s2 = ss2.str();
    cout << " " << s2 << endl;
  }
  else {
    s2 = get_out_message();
  }
  cout << "---------------" << endl;

  if (show_) {
    const auto diff = s.size() - s2.size();
    const auto compression = (diff * 100.0) / s.size();
    cout << "compression: " << compression << "%" << endl;
    cout << "---------------" << endl;
  }
}